

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrsbit.c
# Opt level: O3

FT_Error pfr_load_bitmap_metrics
                   (FT_Byte **pdata,FT_Byte *limit,FT_Long scaled_advance,FT_Long *axpos,
                   FT_Long *aypos,FT_UInt *axsize,FT_UInt *aysize,FT_Long *aadvance,FT_UInt *aformat
                   )

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ushort *puVar9;
  ushort *puVar10;
  FT_UInt FVar11;
  ulong local_38;
  FT_UInt FVar12;
  
  pbVar2 = *pdata;
  if (limit < pbVar2 + 1) {
    return 8;
  }
  bVar1 = *pbVar2;
  switch(bVar1 & 3) {
  case 0:
    puVar9 = (ushort *)(pbVar2 + 2);
    if (limit < puVar9) {
      return 8;
    }
    bVar4 = pbVar2[1];
    local_38 = (ulong)((char)bVar4 >> 4);
    uVar3 = (long)((ulong)bVar4 << 0x3c) >> 0x3c;
    bVar4 = bVar1 >> 2 & 3;
    FVar11 = (FT_UInt)bVar4;
    puVar10 = puVar9;
    uVar5 = FVar11;
    switch(bVar4) {
    case 1:
switchD_0022af5a_caseD_1:
      puVar10 = (ushort *)((long)puVar9 + 1);
      if (limit < puVar10) {
        return 8;
      }
      bVar4 = (byte)*puVar9 >> 4;
      FVar12 = (FT_UInt)bVar4;
      FVar11 = (FT_UInt)bVar4;
      uVar5 = (byte)*puVar9 & 0xf;
      bVar1 = bVar1 >> 4;
      uVar7 = (uint)bVar1;
      uVar8 = (uint)bVar1;
      puVar9 = puVar10;
      uVar6 = uVar5;
      switch(bVar1 & 3) {
      case 0:
        goto switchD_0022b06c_caseD_0;
      case 1:
        goto switchD_0022b06c_caseD_1;
      case 3:
        goto switchD_0022b06c_caseD_3;
      }
      goto switchD_0022b06c_caseD_2;
    case 2:
switchD_0022af5a_caseD_2:
      puVar10 = puVar9 + 1;
      if (limit < puVar10) {
        return 8;
      }
      FVar12 = (FT_UInt)(byte)*puVar9;
      FVar11 = (FT_UInt)(byte)*puVar9;
      uVar6 = (uint)*(byte *)((long)puVar9 + 1);
      uVar5 = (uint)*(byte *)((long)puVar9 + 1);
      bVar1 = bVar1 >> 4;
      uVar7 = (uint)bVar1;
      uVar8 = (uint)bVar1;
      puVar9 = puVar10;
      switch(bVar1 & 3) {
      case 0:
        goto switchD_0022b06c_caseD_0;
      case 2:
        goto switchD_0022b06c_caseD_2;
      case 3:
        goto switchD_0022b06c_caseD_3;
      }
      goto switchD_0022b06c_caseD_1;
    case 3:
switchD_0022af5a_caseD_3:
      puVar10 = puVar9 + 2;
      if (limit < puVar10) {
        return 8;
      }
      FVar11 = (FT_UInt)(ushort)(*puVar9 << 8 | *puVar9 >> 8);
      uVar5 = (uint)(ushort)(puVar9[1] << 8 | puVar9[1] >> 8);
    }
    break;
  case 1:
    puVar9 = (ushort *)(pbVar2 + 3);
    if (limit < puVar9) {
      return 8;
    }
    local_38 = (ulong)(char)pbVar2[1];
    uVar3 = (ulong)(char)pbVar2[2];
    bVar4 = bVar1 >> 2 & 3;
    FVar11 = (FT_UInt)bVar4;
    puVar10 = puVar9;
    uVar5 = FVar11;
    switch(bVar4) {
    case 1:
      goto switchD_0022af5a_caseD_1;
    case 2:
      goto switchD_0022af5a_caseD_2;
    case 3:
      goto switchD_0022af5a_caseD_3;
    }
    break;
  case 2:
    puVar9 = (ushort *)(pbVar2 + 5);
    if (limit < puVar9) {
      return 8;
    }
    local_38 = (long)(short)((ushort)pbVar2[1] << 8) | (ulong)pbVar2[2];
    uVar3 = (long)(short)((ushort)pbVar2[3] << 8) | (ulong)pbVar2[4];
    bVar4 = bVar1 >> 2 & 3;
    FVar11 = (FT_UInt)bVar4;
    puVar10 = puVar9;
    uVar5 = FVar11;
    switch(bVar4) {
    case 1:
      goto switchD_0022af5a_caseD_1;
    case 2:
      goto switchD_0022af5a_caseD_2;
    case 3:
      goto switchD_0022af5a_caseD_3;
    }
    break;
  case 3:
    puVar9 = (ushort *)(pbVar2 + 7);
    if (limit < puVar9) {
      return 8;
    }
    local_38 = (ulong)((int)((uint)pbVar2[3] << 8 |
                            (uint)pbVar2[2] << 0x10 | (uint)pbVar2[1] << 0x18) >> 8);
    uVar3 = (ulong)((int)((uint)pbVar2[6] << 8 | (uint)pbVar2[5] << 0x10 | (uint)pbVar2[4] << 0x18)
                   >> 8);
    bVar4 = bVar1 >> 2 & 3;
    FVar11 = (FT_UInt)bVar4;
    puVar10 = puVar9;
    uVar5 = FVar11;
    switch(bVar4) {
    case 1:
      goto switchD_0022af5a_caseD_1;
    case 2:
      goto switchD_0022af5a_caseD_2;
    case 3:
      goto switchD_0022af5a_caseD_3;
    }
  }
  bVar1 = bVar1 >> 4;
  uVar7 = (uint)bVar1;
  uVar8 = (uint)bVar1;
  puVar9 = puVar10;
  FVar12 = FVar11;
  uVar6 = uVar5;
  switch(bVar1 & 3) {
  case 1:
switchD_0022b06c_caseD_1:
    uVar5 = uVar6;
    FVar11 = FVar12;
    uVar8 = uVar7;
    puVar10 = (ushort *)((long)puVar9 + 1);
    if (limit < puVar10) {
      return 8;
    }
    scaled_advance = (long)(char)(byte)*puVar9 << 8;
    break;
  case 2:
switchD_0022b06c_caseD_2:
    uVar5 = uVar6;
    FVar11 = FVar12;
    uVar8 = uVar7;
    puVar10 = puVar9 + 1;
    if (limit < puVar10) {
      return 8;
    }
    scaled_advance = (long)(short)((ushort)(byte)*puVar9 << 8) | (ulong)*(byte *)((long)puVar9 + 1);
    break;
  case 3:
switchD_0022b06c_caseD_3:
    uVar5 = uVar6;
    FVar11 = FVar12;
    uVar8 = uVar7;
    puVar10 = (ushort *)((long)puVar9 + 3);
    if (limit < puVar10) {
      return 8;
    }
    scaled_advance =
         (FT_Long)((int)((uint)(byte)puVar9[1] << 8 |
                        (uint)*(byte *)((long)puVar9 + 1) << 0x10 | (uint)(byte)*puVar9 << 0x18) >>
                  8);
  }
switchD_0022b06c_caseD_0:
  *axpos = local_38;
  *aypos = uVar3;
  *axsize = FVar11;
  *aysize = uVar5;
  *aadvance = scaled_advance;
  *aformat = uVar8 >> 2;
  *pdata = (FT_Byte *)puVar10;
  return 0;
}

Assistant:

static FT_Error
  pfr_load_bitmap_metrics( FT_Byte**  pdata,
                           FT_Byte*   limit,
                           FT_Long    scaled_advance,
                           FT_Long   *axpos,
                           FT_Long   *aypos,
                           FT_UInt   *axsize,
                           FT_UInt   *aysize,
                           FT_Long   *aadvance,
                           FT_UInt   *aformat )
  {
    FT_Error  error = FT_Err_Ok;
    FT_Byte   flags;
    FT_Byte   b;
    FT_Byte*  p = *pdata;
    FT_Long   xpos, ypos, advance;
    FT_UInt   xsize, ysize;


    PFR_CHECK( 1 );
    flags = PFR_NEXT_BYTE( p );

    xpos    = 0;
    ypos    = 0;
    xsize   = 0;
    ysize   = 0;
    advance = 0;

    switch ( flags & 3 )
    {
    case 0:
      PFR_CHECK( 1 );
      b    = PFR_NEXT_BYTE( p );
      xpos = (FT_Char)b >> 4;
      ypos = ( (FT_Char)( b << 4 ) ) >> 4;
      break;

    case 1:
      PFR_CHECK( 2 );
      xpos = PFR_NEXT_INT8( p );
      ypos = PFR_NEXT_INT8( p );
      break;

    case 2:
      PFR_CHECK( 4 );
      xpos = PFR_NEXT_SHORT( p );
      ypos = PFR_NEXT_SHORT( p );
      break;

    case 3:
      PFR_CHECK( 6 );
      xpos = PFR_NEXT_LONG( p );
      ypos = PFR_NEXT_LONG( p );
      break;

    default:
      ;
    }

    flags >>= 2;
    switch ( flags & 3 )
    {
    case 0:
      /* blank image */
      xsize = 0;
      ysize = 0;
      break;

    case 1:
      PFR_CHECK( 1 );
      b     = PFR_NEXT_BYTE( p );
      xsize = ( b >> 4 ) & 0xF;
      ysize = b & 0xF;
      break;

    case 2:
      PFR_CHECK( 2 );
      xsize = PFR_NEXT_BYTE( p );
      ysize = PFR_NEXT_BYTE( p );
      break;

    case 3:
      PFR_CHECK( 4 );
      xsize = PFR_NEXT_USHORT( p );
      ysize = PFR_NEXT_USHORT( p );
      break;

    default:
      ;
    }

    flags >>= 2;
    switch ( flags & 3 )
    {
    case 0:
      advance = scaled_advance;
      break;

    case 1:
      PFR_CHECK( 1 );
      advance = PFR_NEXT_INT8( p ) * 256;
      break;

    case 2:
      PFR_CHECK( 2 );
      advance = PFR_NEXT_SHORT( p );
      break;

    case 3:
      PFR_CHECK( 3 );
      advance = PFR_NEXT_LONG( p );
      break;

    default:
      ;
    }

    *axpos    = xpos;
    *aypos    = ypos;
    *axsize   = xsize;
    *aysize   = ysize;
    *aadvance = advance;
    *aformat  = flags >> 2;
    *pdata    = p;

  Exit:
    return error;

  Too_Short:
    error = FT_THROW( Invalid_Table );
    FT_ERROR(( "pfr_load_bitmap_metrics: invalid glyph data\n" ));
    goto Exit;
  }